

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizard::setWizardStyle(QWizard *this,WizardStyle style)

{
  QWizardPrivate *pQVar1;
  WizardStyle in_ESI;
  undefined1 uVar2;
  QWizardPrivate *in_stack_00000008;
  bool styleChange;
  QWizardPrivate *d;
  QWizardPrivate *in_stack_00000040;
  undefined7 in_stack_ffffffffffffffe0;
  
  pQVar1 = d_func((QWizard *)0x7bb3ef);
  uVar2 = in_ESI != pQVar1->wizStyle;
  if ((bool)uVar2) {
    QWizardPrivate::disableUpdates((QWizardPrivate *)CONCAT17(uVar2,in_stack_ffffffffffffffe0));
    pQVar1->wizStyle = in_ESI;
    QWizardPrivate::updateButtonTexts(in_stack_00000008);
    QWizardPrivate::updateLayout(in_stack_00000040);
    QWidget::updateGeometry((QWidget *)CONCAT17(uVar2,in_stack_ffffffffffffffe0));
    QWizardPrivate::enableUpdates((QWizardPrivate *)CONCAT17(uVar2,in_stack_ffffffffffffffe0));
  }
  return;
}

Assistant:

void QWizard::setWizardStyle(WizardStyle style)
{
    Q_D(QWizard);

    const bool styleChange = style != d->wizStyle;

#if QT_CONFIG(style_windowsvista)
    const bool aeroStyleChange =
        d->vistaInitPending || d->vistaStateChanged || (styleChange && (style == AeroStyle || d->wizStyle == AeroStyle));
    d->vistaStateChanged = false;
    d->vistaInitPending = false;
#endif

    if (styleChange
#if QT_CONFIG(style_windowsvista)
        || aeroStyleChange
#endif
        ) {
        d->disableUpdates();
        d->wizStyle = style;
        d->updateButtonTexts();
#if QT_CONFIG(style_windowsvista)
        if (aeroStyleChange) {
            //Send a resizeevent since the antiflicker widget probably needs a new size
            //because of the backbutton in the window title
            QResizeEvent ev(geometry().size(), geometry().size());
            QCoreApplication::sendEvent(this, &ev);
        }
#endif
        d->updateLayout();
        updateGeometry();
        d->enableUpdates();
#if QT_CONFIG(style_windowsvista)
        // Delay initialization when activating Aero style fails due to missing native window.
        if (aeroStyleChange && !d->handleAeroStyleChange() && d->wizStyle == AeroStyle)
            d->vistaInitPending = true;
#endif
    }